

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O3

NSVGimage * nsvgParse(char *input,char *units,float dpi)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined8 uVar3;
  undefined4 uVar5;
  char cVar6;
  int iVar7;
  float *pfVar8;
  NSVGgradient *pNVar9;
  NSVGgradientData *pNVar10;
  NSVGgradientData *__ptr;
  NSVGparser *p;
  NSVGimage *pNVar11;
  NSVGshape *pNVar12;
  NSVGpath *pNVar13;
  long lVar14;
  NSVGshape *pNVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  float fVar20;
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float local_98;
  float fStack_94;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined1 auVar24 [16];
  
  p = (NSVGparser *)calloc(1,0x9c60);
  if (p == (NSVGparser *)0x0) {
    return (NSVGimage *)0x0;
  }
  pNVar11 = (NSVGimage *)calloc(1,0x10);
  p->image = pNVar11;
  if (pNVar11 == (NSVGimage *)0x0) {
    free(p);
    return (NSVGimage *)0x0;
  }
  p->attr[0].xform[0] = 1.0;
  p->attr[0].xform[3] = 1.0;
  p->attr[0].opacity = 1.0;
  p->attr[0].fillOpacity = 1.0;
  p->attr[0].strokeOpacity = 1.0;
  p->attr[0].stopOpacity = 1.0;
  p->attr[0].strokeWidth = 1.0;
  p->attr[0].miterLimit = 4.0;
  p->attr[0].hasFill = '\x01';
  p->attr[0].visible = '\x01';
  p->dpi = dpi;
  nsvg__parseXML(input,nsvg__startElement,nsvg__endElement,nsvg__content,p);
  pNVar11 = p->image;
  pNVar15 = pNVar11->shapes;
  if (pNVar15 == (NSVGshape *)0x0) {
    fVar20 = 0.0;
    fVar31 = 0.0;
    fVar23 = 0.0;
    fVar27 = 0.0;
  }
  else {
    fVar20 = pNVar15->bounds[0];
    fVar31 = pNVar15->bounds[1];
    fVar23 = pNVar15->bounds[2];
    fVar27 = pNVar15->bounds[3];
    for (pNVar12 = pNVar15->next; pNVar12 != (NSVGshape *)0x0; pNVar12 = pNVar12->next) {
      uVar16 = -(uint)(fVar20 < pNVar12->bounds[0]);
      uVar17 = -(uint)(fVar31 < pNVar12->bounds[1]);
      uVar18 = -(uint)(pNVar12->bounds[2] < fVar23);
      uVar19 = -(uint)(pNVar12->bounds[3] < fVar27);
      fVar20 = (float)((uint)fVar20 & uVar16 | ~uVar16 & (uint)pNVar12->bounds[0]);
      fVar31 = (float)((uint)fVar31 & uVar17 | ~uVar17 & (uint)pNVar12->bounds[1]);
      fVar23 = (float)((uint)fVar23 & uVar18 | ~uVar18 & (uint)pNVar12->bounds[2]);
      fVar27 = (float)((uint)fVar27 & uVar19 | ~uVar19 & (uint)pNVar12->bounds[3]);
    }
  }
  fVar29 = p->viewWidth;
  fVar30 = 0.0;
  if ((fVar29 == 0.0) && (!NAN(fVar29))) {
    fVar29 = pNVar11->width;
    fVar30 = 0.0;
    if (fVar29 <= 0.0) {
      p->viewMinx = fVar20;
      fVar29 = fVar23 - fVar20;
      fVar30 = fVar27;
    }
    p->viewWidth = fVar29;
  }
  fVar20 = p->viewHeight;
  fVar23 = 0.0;
  if ((fVar20 == 0.0) && (!NAN(fVar20))) {
    fVar20 = pNVar11->height;
    fVar23 = 0.0;
    if (fVar20 <= 0.0) {
      p->viewMiny = fVar31;
      fVar20 = fVar27 - fVar31;
      fVar23 = fVar27;
    }
    p->viewHeight = fVar20;
  }
  fVar31 = pNVar11->width;
  fVar27 = 0.0;
  if ((fVar31 == 0.0) && (!NAN(fVar31))) {
    pNVar11->width = fVar29;
    fVar31 = fVar29;
    fVar27 = fVar30;
  }
  fVar32 = pNVar11->height;
  fVar28 = 0.0;
  if ((fVar32 == 0.0) && (!NAN(fVar32))) {
    pNVar11->height = fVar20;
    fVar32 = fVar20;
    fVar28 = fVar23;
  }
  uVar1 = p->viewMinx;
  uVar4 = p->viewMiny;
  auVar21._4_4_ = fVar30;
  auVar21._0_4_ = fVar29;
  auVar21._8_4_ = fVar30;
  auVar21._12_4_ = fVar23;
  auVar26._8_8_ = auVar21._8_8_;
  auVar26._4_4_ = fVar20;
  auVar26._0_4_ = fVar29;
  auVar25._4_4_ = fVar27;
  auVar25._0_4_ = fVar31;
  auVar25._8_4_ = fVar27;
  auVar25._12_4_ = fVar28;
  auVar24._8_8_ = auVar25._8_8_;
  auVar24._4_4_ = fVar32;
  auVar24._0_4_ = fVar31;
  auVar26 = divps(auVar24,auVar26);
  fVar23 = (float)(auVar26._0_4_ & -(uint)(0.0 < fVar29));
  fVar27 = (float)(auVar26._4_4_ & -(uint)(0.0 < fVar20));
  uVar16 = nsvg__parseUnits(units);
  fVar30 = nsvg__convertToPixels(p,(NSVGcoordinate)(((ulong)uVar16 << 0x20) + 0x3f800000),0.0,1.0);
  if (p->alignType == 2) {
    if (fVar23 <= fVar27) {
      fVar23 = fVar27;
    }
    fVar28 = 0.0;
    if (p->alignX != 0) {
      if (p->alignX == 2) {
        fVar28 = fVar31 - fVar29 * fVar23;
      }
      else {
        fVar28 = (fVar31 - fVar29 * fVar23) * 0.5;
      }
    }
    fVar28 = fVar28 / fVar23;
    if (p->alignY == 0) {
      fVar32 = 0.0;
    }
    else {
      fVar32 = fVar32 - fVar20 * fVar23;
      if (p->alignY != 2) {
        fVar32 = fVar32 * 0.5;
      }
    }
    fVar22 = fVar32 / fVar23;
  }
  else {
    if (p->alignType != 1) {
      fVar28 = -(float)uVar1;
      fVar22 = -(float)uVar4;
      goto LAB_00157011;
    }
    if (fVar27 <= fVar23) {
      fVar23 = fVar27;
    }
    fVar22 = 0.0;
    fVar28 = 0.0;
    if (p->alignX != 0) {
      if (p->alignX == 2) {
        fVar28 = fVar31 - fVar29 * fVar23;
      }
      else {
        fVar28 = (fVar31 - fVar29 * fVar23) * 0.5;
      }
    }
    fVar28 = fVar28 / fVar23;
    if (p->alignY != 0) {
      if (p->alignY == 2) {
        fVar22 = fVar32 - fVar20 * fVar23;
      }
      else {
        fVar22 = (fVar32 - fVar20 * fVar23) * 0.5;
      }
    }
    fVar22 = fVar22 / fVar23;
  }
  fVar28 = fVar28 - (float)uVar1;
  fVar22 = fVar22 - (float)uVar4;
  fVar27 = fVar23;
LAB_00157011:
  if (pNVar15 != (NSVGshape *)0x0) {
    fVar23 = (1.0 / fVar30) * fVar23;
    fVar27 = (1.0 / fVar30) * fVar27;
    fVar20 = (fVar27 + fVar23) * 0.5;
    local_48 = fVar22;
    fStack_44 = fVar22;
    fStack_40 = fVar22;
    fStack_3c = fVar22;
    local_38 = fVar20;
    fStack_34 = fVar20;
    fStack_30 = fVar20;
    fStack_2c = fVar20;
    do {
      fVar31 = pNVar15->bounds[1];
      fVar29 = pNVar15->bounds[2];
      fVar30 = pNVar15->bounds[3];
      pNVar15->bounds[0] = (pNVar15->bounds[0] + fVar28) * fVar23;
      pNVar15->bounds[1] = (fVar31 + fVar22) * fVar27;
      pNVar15->bounds[2] = (fVar29 + fVar28) * fVar23;
      pNVar15->bounds[3] = (fVar30 + fVar22) * fVar27;
      for (pNVar13 = pNVar15->paths; pNVar13 != (NSVGpath *)0x0; pNVar13 = pNVar13->next) {
        fVar31 = pNVar13->bounds[1];
        fVar29 = pNVar13->bounds[2];
        fVar30 = pNVar13->bounds[3];
        pNVar13->bounds[0] = (pNVar13->bounds[0] + fVar28) * fVar23;
        pNVar13->bounds[1] = (fVar31 + fVar22) * fVar27;
        pNVar13->bounds[2] = (fVar29 + fVar28) * fVar23;
        pNVar13->bounds[3] = (fVar30 + fVar22) * fVar27;
        iVar7 = pNVar13->npts;
        if (0 < (long)iVar7) {
          pfVar8 = pNVar13->pts;
          lVar14 = 0;
          do {
            uVar3 = *(undefined8 *)(pfVar8 + lVar14 * 2);
            *(ulong *)(pfVar8 + lVar14 * 2) =
                 CONCAT44(((float)((ulong)uVar3 >> 0x20) + fVar22) * fVar27,
                          ((float)uVar3 + fVar28) * fVar23);
            lVar14 = lVar14 + 1;
          } while (iVar7 != lVar14);
        }
      }
      if (((pNVar15->fill).type & 0xfeU) == 2) {
        nsvg__scaleGradient((pNVar15->fill).field_1.gradient,fVar28,local_48,fVar23,fVar27);
        pNVar9 = (pNVar15->fill).field_1.gradient;
        local_58 = *(undefined8 *)(pNVar9->xform + 4);
        local_68 = *(undefined8 *)pNVar9->xform;
        uStack_60 = *(undefined8 *)(pNVar9->xform + 2);
        nsvg__xformInverse(pNVar9->xform,(float *)&local_68);
      }
      if (((pNVar15->stroke).type & 0xfeU) == 2) {
        nsvg__scaleGradient((pNVar15->stroke).field_1.gradient,fVar28,local_48,fVar23,fVar27);
        pNVar9 = (pNVar15->stroke).field_1.gradient;
        local_58 = *(undefined8 *)(pNVar9->xform + 4);
        local_68 = *(undefined8 *)pNVar9->xform;
        uStack_60 = *(undefined8 *)(pNVar9->xform + 2);
        nsvg__xformInverse(pNVar9->xform,(float *)&local_68);
      }
      uVar2 = pNVar15->strokeWidth;
      uVar5 = pNVar15->strokeDashOffset;
      pNVar15->strokeWidth = (float)uVar2 * local_38;
      pNVar15->strokeDashOffset = (float)uVar5 * fStack_34;
      cVar6 = pNVar15->strokeDashCount;
      if (0 < (long)cVar6) {
        lVar14 = 0;
        do {
          pNVar15->strokeDashArray[lVar14] = pNVar15->strokeDashArray[lVar14] * fVar20;
          lVar14 = lVar14 + 1;
        } while (cVar6 != lVar14);
      }
      pNVar15 = pNVar15->next;
    } while (pNVar15 != (NSVGshape *)0x0);
    pNVar11 = p->image;
  }
  p->image = (NSVGimage *)0x0;
  nsvg__deletePaths(p->plist);
  __ptr = p->gradients;
  while (__ptr != (NSVGgradientData *)0x0) {
    pNVar10 = __ptr->next;
    free(__ptr->stops);
    free(__ptr);
    __ptr = pNVar10;
  }
  nsvgDelete(p->image);
  free(p->pts);
  free(p);
  return pNVar11;
}

Assistant:

NSVGimage* nsvgParse(char* input, const char* units, float dpi)
{
	NSVGparser* p;
	NSVGimage* ret = 0;

	p = nsvg__createParser();
	if (p == NULL) {
		return NULL;
	}
	p->dpi = dpi;

	nsvg__parseXML(input, nsvg__startElement, nsvg__endElement, nsvg__content, p);

	// Scale to viewBox
	nsvg__scaleToViewbox(p, units);

	ret = p->image;
	p->image = NULL;

	nsvg__deleteParser(p);

	return ret;
}